

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  u32 uVar1;
  undefined8 *puVar2;
  void *p_00;
  sqlite3_vfs *psVar3;
  Vdbe *pVVar4;
  char *pcVar5;
  ExprList *pEVar6;
  IdList *pIVar7;
  Expr *pEVar8;
  undefined4 in_EDX;
  u32 *in_RSI;
  ExprList *in_RDI;
  Subquery *pNewSubq;
  Table *pTab;
  SrcItem *pOldItem;
  SrcItem *pNewItem;
  int nByte;
  int i;
  SrcList *pNew;
  sqlite3 *in_stack_ffffffffffffffb0;
  sqlite3 *in_stack_ffffffffffffffb8;
  sqlite3 *db_00;
  sqlite3 *db_01;
  sqlite3 *db_02;
  int flags_00;
  undefined4 in_stack_ffffffffffffffe0;
  sqlite3 *in_stack_fffffffffffffff8;
  Select *pDup;
  
  if (in_RSI == (u32 *)0x0) {
    pDup = (Select *)0x0;
  }
  else {
    if ((int)*in_RSI < 1) {
      p_00 = (void *)0x0;
    }
    else {
      p_00 = (void *)((long)(int)(*in_RSI - 1) * 0x48);
    }
    pDup = (Select *)sqlite3DbMallocRawNN(in_stack_ffffffffffffffb8,(u64)in_stack_ffffffffffffffb0);
    if (pDup == (Select *)0x0) {
      pDup = (Select *)0x0;
    }
    else {
      uVar1 = *in_RSI;
      pDup->selFlags = uVar1;
      pDup->op = (char)uVar1;
      pDup->field_0x1 = (char)(uVar1 >> 8);
      pDup->nSelectRow = (short)(uVar1 >> 0x10);
      for (flags_00 = 0; flags_00 < (int)*in_RSI; flags_00 = flags_00 + 1) {
        db_02 = (sqlite3 *)(pDup->addrOpenEphm + (long)flags_00 * 0x12 + -3);
        db_01 = (sqlite3 *)(in_RSI + (long)flags_00 * 0x12 + 2);
        db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
        *(undefined4 *)&db_02->mutex = *(undefined4 *)&db_01->mutex;
        if ((*(ushort *)((long)&db_01->mutex + 1) >> 2 & 1) == 0) {
          if (((ulong)db_01->mutex & 0x1000000) == 0) {
            pcVar5 = sqlite3DbStrDup((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,
                                     (char *)in_stack_ffffffffffffffb0);
            db_02->szMmap = (i64)pcVar5;
          }
          else {
            db_02->szMmap = db_01->szMmap;
          }
        }
        else {
          in_stack_ffffffffffffffb0 =
               (sqlite3 *)
               sqlite3DbMallocRaw((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,(u64)in_stack_ffffffffffffffb0);
          if (in_stack_ffffffffffffffb0 == (sqlite3 *)0x0) {
            *(ushort *)((long)&db_02->mutex + 1) = *(ushort *)((long)&db_02->mutex + 1) & 0xfffb;
          }
          else {
            puVar2 = (undefined8 *)db_01->szMmap;
            in_stack_ffffffffffffffb0->pVfs = (sqlite3_vfs *)*puVar2;
            in_stack_ffffffffffffffb0->pVdbe = (Vdbe *)puVar2[1];
            in_stack_ffffffffffffffb0->pDfltColl = (CollSeq *)puVar2[2];
            psVar3 = (sqlite3_vfs *)
                     sqlite3SelectDup((sqlite3 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),pDup,
                                      flags_00);
            in_stack_ffffffffffffffb0->pVfs = psVar3;
            if (in_stack_ffffffffffffffb0->pVfs == (sqlite3_vfs *)0x0) {
              sqlite3DbFree(in_stack_ffffffffffffffb0,p_00);
              in_stack_ffffffffffffffb0 = (sqlite3 *)0x0;
              *(ushort *)((long)&db_02->mutex + 1) = *(ushort *)((long)&db_02->mutex + 1) & 0xfffb;
            }
          }
          db_02->szMmap = (i64)in_stack_ffffffffffffffb0;
        }
        psVar3 = (sqlite3_vfs *)sqlite3DbStrDup(db_00,(char *)in_stack_ffffffffffffffb0);
        db_02->pVfs = psVar3;
        pVVar4 = (Vdbe *)sqlite3DbStrDup(db_00,(char *)in_stack_ffffffffffffffb0);
        db_02->pVdbe = pVVar4;
        ((anon_union_8_3_fafd40d6_for_u1 *)((long)&db_02->mutex + 4))->nRow =
             *(u32 *)((long)&db_01->mutex + 4);
        if ((*(ushort *)((long)&db_02->mutex + 1) >> 1 & 1) == 0) {
          if ((*(ushort *)((long)&db_02->mutex + 1) >> 3 & 1) == 0) {
            db_02->nDb = db_01->nDb;
          }
          else {
            pEVar6 = sqlite3ExprListDup(in_stack_fffffffffffffff8,in_RDI,
                                        (int)((ulong)in_RSI >> 0x20));
            *(ExprList **)&db_02->nDb = pEVar6;
          }
        }
        else {
          pcVar5 = sqlite3DbStrDup(db_00,(char *)in_stack_ffffffffffffffb0);
          *(char **)&db_02->nDb = pcVar5;
        }
        db_02->flags = db_01->flags;
        if ((*(ushort *)((long)&db_02->mutex + 1) >> 9 & 1) != 0) {
          *(int *)db_02->flags = *(int *)db_02->flags + 1;
        }
        pEVar8 = (Expr *)db_01->pDfltColl;
        db_02->pDfltColl = (CollSeq *)pEVar8;
        if (pEVar8 != (Expr *)0x0) {
          pEVar8->iTable = pEVar8->iTable + 1;
        }
        if ((*(ushort *)((long)&db_01->mutex + 1) >> 0xb & 1) == 0) {
          pEVar8 = sqlite3ExprDup(db_01,pEVar8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          db_02->lastRowid = (i64)pEVar8;
        }
        else {
          pIVar7 = sqlite3IdListDup(db_02,(IdList *)db_01);
          db_02->lastRowid = (i64)pIVar7;
        }
        db_02->aDb = db_01->aDb;
      }
    }
  }
  return (SrcList *)pDup;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, const SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  assert( db!=0 );
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRawNN(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    SrcItem *pNewItem = &pNew->a[i];
    const SrcItem *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->fg = pOldItem->fg;
    if( pOldItem->fg.isSubquery ){
      Subquery *pNewSubq = sqlite3DbMallocRaw(db, sizeof(Subquery));
      if( pNewSubq==0 ){
        assert( db->mallocFailed );
        pNewItem->fg.isSubquery = 0;
      }else{
        memcpy(pNewSubq, pOldItem->u4.pSubq, sizeof(*pNewSubq));
        pNewSubq->pSelect = sqlite3SelectDup(db, pNewSubq->pSelect, flags);
        if( pNewSubq->pSelect==0 ){
          sqlite3DbFree(db, pNewSubq);
          pNewSubq = 0;
          pNewItem->fg.isSubquery = 0;
        }
      }
      pNewItem->u4.pSubq = pNewSubq;
    }else if( pOldItem->fg.fixedSchema ){
      pNewItem->u4.pSchema = pOldItem->u4.pSchema;
    }else{
      pNewItem->u4.zDatabase = sqlite3DbStrDup(db, pOldItem->u4.zDatabase);
    }
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->iCursor = pOldItem->iCursor;
    if( pNewItem->fg.isIndexedBy ){
      pNewItem->u1.zIndexedBy = sqlite3DbStrDup(db, pOldItem->u1.zIndexedBy);
    }else if( pNewItem->fg.isTabFunc ){
      pNewItem->u1.pFuncArg =
          sqlite3ExprListDup(db, pOldItem->u1.pFuncArg, flags);
    }else{
      pNewItem->u1.nRow = pOldItem->u1.nRow;
    }
    pNewItem->u2 = pOldItem->u2;
    if( pNewItem->fg.isCte ){
      pNewItem->u2.pCteUse->nUse++;
    }
    pTab = pNewItem->pSTab = pOldItem->pSTab;
    if( pTab ){
      pTab->nTabRef++;
    }
    if( pOldItem->fg.isUsing ){
      assert( pNewItem->fg.isUsing );
      pNewItem->u3.pUsing = sqlite3IdListDup(db, pOldItem->u3.pUsing);
    }else{
      pNewItem->u3.pOn = sqlite3ExprDup(db, pOldItem->u3.pOn, flags);
    }
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}